

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfmon_inl.h
# Opt level: O2

Counter * __thiscall
perfmon::Counters::operator[](Counter *__return_storage_ptr__,Counters *this,char *name)

{
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  
  pCVar4 = (this->super_vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>).
           super__Vector_base<perfmon::Counter,_std::allocator<perfmon::Counter>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar4 == (this->super_vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>).
                  super__Vector_base<perfmon::Counter,_std::allocator<perfmon::Counter>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      if ((operator[](char_const*)::NONE_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&operator[](char_const*)::NONE_abi_cxx11_), iVar3 != 0)) {
        operator[](char_const*)::NONE_abi_cxx11_._M_dataplus._M_p =
             (pointer)&operator[](char_const*)::NONE_abi_cxx11_.field_2;
        operator[](char_const*)::NONE_abi_cxx11_._M_string_length = 0;
        operator[](char_const*)::NONE_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,&operator[](char_const*)::NONE_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&operator[](char_const*)::NONE_abi_cxx11_);
      }
      __return_storage_ptr__->name_ptr_ = &operator[](char_const*)::NONE_abi_cxx11_;
      __return_storage_ptr__->calls_ = 0;
      __return_storage_ptr__->ticks_ = 0;
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==(pCVar4->name_ptr_,name);
    if (bVar2) break;
    pCVar4 = pCVar4 + 1;
  }
  __return_storage_ptr__->ticks_ = pCVar4->ticks_;
  uVar1 = pCVar4->calls_;
  __return_storage_ptr__->name_ptr_ = pCVar4->name_ptr_;
  __return_storage_ptr__->calls_ = uVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Counter Counters::operator[](const char *name) const {
  for (auto it = begin(); it != end(); ++it) {
    if (it->Name() == name) {
      return *it;
    }
  }
  static const std::string NONE;
  return Counter(&NONE, 0, 0);
}